

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSweep.c
# Opt level: O0

int Cec_ManFraClassesUpdate_rec(Gia_Obj_t *pObj)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  ulong uVar5;
  int Result;
  Gia_Obj_t *pObj_local;
  
  if ((*(ulong *)pObj >> 0x1e & 1) == 0) {
    iVar1 = Gia_ObjIsCi(pObj);
    if ((iVar1 == 0) && (iVar1 = Gia_ObjIsConst0(pObj), iVar1 == 0)) {
      pGVar4 = Gia_ObjFanin0(pObj);
      uVar2 = Cec_ManFraClassesUpdate_rec(pGVar4);
      pGVar4 = Gia_ObjFanin1(pObj);
      uVar3 = Cec_ManFraClassesUpdate_rec(pGVar4);
      uVar5 = (ulong)(uVar2 | uVar3) & 1;
      *(ulong *)pObj = *(ulong *)pObj & 0xffffffffbfffffff | uVar5 << 0x1e;
      return (int)uVar5;
    }
    pObj_local._4_4_ = 0;
  }
  else {
    pObj_local._4_4_ = 1;
  }
  return pObj_local._4_4_;
}

Assistant:

int Cec_ManFraClassesUpdate_rec( Gia_Obj_t * pObj )
{
    int Result;
    if ( pObj->fMark0 )
        return 1;
    if ( Gia_ObjIsCi(pObj) || Gia_ObjIsConst0(pObj) )
        return 0;
    Result = (Cec_ManFraClassesUpdate_rec( Gia_ObjFanin0(pObj) ) |
              Cec_ManFraClassesUpdate_rec( Gia_ObjFanin1(pObj) ));
    return pObj->fMark0 = Result;
}